

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

ProString * __thiscall
QMakeProject::expand(QMakeProject *this,QString *expr,QString *where,int line)

{
  long lVar1;
  QStringView contents;
  bool bVar2;
  VisitReturn VVar3;
  QMakeEvaluator *this_00;
  qsizetype in_RDX;
  QString *in_RSI;
  ProString *in_RDI;
  long in_FS_OFFSET;
  ProFile *pro;
  ProString *ret;
  ProStringList result;
  ushort *tokPtr;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff6c;
  ProFile *in_stack_ffffffffffffff70;
  ProString *this_01;
  int sizeHint;
  ushort **tokPtr_00;
  QMakeParser *in_stack_ffffffffffffff98;
  QString *pQVar5;
  SubGrammar in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar5 = in_RSI;
  memset(in_RDI,0xaa,0x30);
  ProString::ProString((ProString *)in_stack_ffffffffffffff70);
  tokPtr_00 = (ushort **)in_RSI[0x1b].d.size;
  QStringView::QStringView<QString,_true>((QStringView *)this_01,&in_RDI->m_string);
  uVar4 = 2;
  contents.m_data = (storage_type_conflict *)pQVar5;
  contents.m_size = in_RDX;
  this_00 = (QMakeEvaluator *)
            QMakeParser::parsedProBlock
                      (in_stack_ffffffffffffff98,contents,(int)((ulong)tokPtr_00 >> 0x20),in_RSI,
                       (int)((ulong)this_01 >> 0x20),in_stack_ffffffffffffffd0);
  bVar2 = ProFile::isOk((ProFile *)this_00);
  if (bVar2) {
    (in_RSI->d).size = (qsizetype)this_00;
    *(undefined2 *)&in_RSI[1].d.d = 0;
    ProFile::tokPtr((ProFile *)0x32d730);
    sizeHint = (int)((ulong)in_RSI >> 0x20);
    ProStringList::ProStringList((ProStringList *)0x32d763);
    VVar3 = QMakeEvaluator::expandVariableReferences
                      (this_00,tokPtr_00,sizeHint,(ProStringList *)this_01,
                       SUB81((ulong)in_RDI >> 0x38,0));
    if (VVar3 == ReturnError) {
      exit(3);
    }
    bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x32d799);
    if (!bVar2) {
      QList<ProString>::at
                ((QList<ProString> *)in_stack_ffffffffffffff70,
                 CONCAT44(in_stack_ffffffffffffff6c,uVar4));
      ProString::operator=
                ((ProString *)in_stack_ffffffffffffff70,
                 (ProString *)CONCAT44(in_stack_ffffffffffffff6c,uVar4));
    }
    ProStringList::~ProStringList((ProStringList *)0x32d7c2);
  }
  ProFile::deref(in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

ProString QMakeProject::expand(const QString &expr, const QString &where, int line)
{
    ProString ret;
    ProFile *pro = m_parser->parsedProBlock(QStringView(expr), 0, where, line,
                                            QMakeParser::ValueGrammar);
    if (pro->isOk()) {
        m_current.pro = pro;
        m_current.line = 0;
        const ushort *tokPtr = pro->tokPtr();
        ProStringList result;
        if (expandVariableReferences(tokPtr, 1, &result, true) == ReturnError)
            exit(3);
        if (!result.isEmpty())
            ret = result.at(0);
    }
    pro->deref();
    return ret;
}